

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::addInt(Builder *this,int64_t v)

{
  Builder *in_RSI;
  undefined8 in_RDI;
  uint8_t unaff_retaddr;
  uint8_t value;
  
  value = (uint8_t)((ulong)in_RDI >> 0x38);
  if (((long)in_RSI < 0) || (9 < (long)in_RSI)) {
    if (((long)in_RSI < 0) && (-7 < (long)in_RSI)) {
      appendByte(in_RSI,value);
    }
    else {
      appendInt(this,v,unaff_retaddr);
    }
  }
  else {
    appendByte(in_RSI,value);
  }
  return;
}

Assistant:

void addInt(int64_t v) {
    if (v >= 0 && v <= 9) {
      // SmallInt
      appendByte(static_cast<uint8_t>(0x30 + v));
    } else if (v < 0 && v >= -6) {
      // SmallInt
      appendByte(static_cast<uint8_t>(0x40 + v));
    } else {
      // regular int
      appendInt(v, 0x1f);
    }
  }